

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  size_t *__k;
  size_t *this;
  uint __line;
  bool bVar1;
  type *ptVar2;
  ostream *poVar3;
  mapped_type *pmVar4;
  int i;
  int iVar5;
  char *__assertion;
  undefined1 local_2c0 [8];
  struct_helper<A> a;
  ostringstream oss;
  undefined1 local_110 [8];
  string str;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  map2;
  A *local_a8;
  holder h;
  undefined1 local_98 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  map;
  _Vector_base<int,_std::allocator<int>_> _Stack_60;
  undefined8 local_48;
  allocator_type local_36;
  allocator_type local_35;
  A local_34 [2];
  A aa;
  
  jsonip::detail::struct_helper<A>::struct_helper((struct_helper<A> *)local_2c0);
  ptVar2 = jsonip::detail::calculate_helper<A>::instance();
  if (ptVar2 == (type *)0x0) {
    __assertion = "detail::get_helper(aa)";
    __line = 0x22;
  }
  else {
    local_a8 = local_34;
    ptVar2 = jsonip::detail::calculate_helper<A>::instance();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &a.super_struct_helper_base.accessors._M_t._M_impl.super__Rb_tree_header.
                _M_node_count,"a",(allocator<char> *)(str.field_2._M_local_buf + 8));
    (*(ptVar2->super_struct_helper_base).super_helper._vptr_helper[7])
              (local_98,ptVar2,&local_a8,
               &a.super_struct_helper_base.accessors._M_t._M_impl.super__Rb_tree_header.
                _M_node_count);
    std::__cxx11::string::~string
              ((string *)
               &a.super_struct_helper_base.accessors._M_t._M_impl.super__Rb_tree_header.
                _M_node_count);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &a.super_struct_helper_base.accessors._M_t._M_impl.super__Rb_tree_header.
                _M_node_count,"{}",(allocator<char> *)local_98);
    bVar1 = jsonip::parse<A>(local_34,(string *)
                                      &a.super_struct_helper_base.accessors._M_t._M_impl.
                                       super__Rb_tree_header._M_node_count);
    if (bVar1) {
      std::__cxx11::string::~string
                ((string *)
                 &a.super_struct_helper_base.accessors._M_t._M_impl.super__Rb_tree_header.
                  _M_node_count);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 &a.super_struct_helper_base.accessors._M_t._M_impl.super__Rb_tree_header.
                  _M_node_count,"{\"a\" : 120}",(allocator<char> *)local_98);
      bVar1 = jsonip::parse<A>(local_34,(string *)
                                        &a.super_struct_helper_base.accessors._M_t._M_impl.
                                         super__Rb_tree_header._M_node_count);
      if (bVar1) {
        std::__cxx11::string::~string
                  ((string *)
                   &a.super_struct_helper_base.accessors._M_t._M_impl.super__Rb_tree_header.
                    _M_node_count);
        poVar3 = std::ostream::_M_insert<void_const*>(&std::cout);
        std::endl<char,std::char_traits<char>>(poVar3);
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_34[0].a);
        std::endl<char,std::char_traits<char>>(poVar3);
        jsonip::write<A>((ostream *)&std::cout,local_34,true);
        poVar3 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        std::endl<char,std::char_traits<char>>(poVar3);
        local_98._0_4_ = 100;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)
                   &a.super_struct_helper_base.accessors._M_t._M_impl.super__Rb_tree_header.
                    _M_node_count,100,(value_type_conflict1 *)local_98,
                   (allocator_type *)(str.field_2._M_local_buf + 8));
        jsonip::write<std::vector<int,std::allocator<int>>>
                  ((ostream *)&std::cout,
                   (vector<int,_std::allocator<int>_> *)
                   &a.super_struct_helper_base.accessors._M_t._M_impl.super__Rb_tree_header.
                    _M_node_count,true);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)
                   &a.super_struct_helper_base.accessors._M_t._M_impl.super__Rb_tree_header.
                    _M_node_count);
        poVar3 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        std::endl<char,std::char_traits<char>>(poVar3);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   &a.super_struct_helper_base.accessors._M_t._M_impl.super__Rb_tree_header.
                    _M_node_count,"asd",(allocator<char> *)(str.field_2._M_local_buf + 8));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_98,100,
                 (value_type *)
                 &a.super_struct_helper_base.accessors._M_t._M_impl.super__Rb_tree_header.
                  _M_node_count,
                 (allocator_type *)&map._M_t._M_impl.super__Rb_tree_header._M_node_count);
        jsonip::write<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  ((ostream *)&std::cout,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_98,true);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_98);
        std::__cxx11::string::~string
                  ((string *)
                   &a.super_struct_helper_base.accessors._M_t._M_impl.super__Rb_tree_header.
                    _M_node_count);
        poVar3 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        std::endl<char,std::char_traits<char>>(poVar3);
        map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&map;
        map._M_t._M_impl._0_4_ = 0;
        map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        map._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
        map2._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&map2;
        map2._M_t._M_impl._0_4_ = 0;
        map2._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        map2._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        map2._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
        this = &a.super_struct_helper_base.accessors._M_t._M_impl.super__Rb_tree_header.
                _M_node_count;
        __k = &map._M_t._M_impl.super__Rb_tree_header._M_node_count;
        map2._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             map2._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        for (iVar5 = 0; iVar5 != 100; iVar5 = iVar5 + 1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
          std::ostream::operator<<((ostream *)this,iVar5);
          h.t = (void *)((double)iVar5 * 3.3333333333333335);
          std::__cxx11::stringbuf::str();
          pmVar4 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                                 *)local_98,(key_type *)__k);
          *pmVar4 = (mapped_type)h.t;
          std::__cxx11::string::~string((string *)__k);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
        }
        jsonip::
        write<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>>
                  ((ostream *)&std::cout,
                   (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                    *)local_98,true);
        poVar3 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        std::endl<char,std::char_traits<char>>(poVar3);
        std::__cxx11::ostringstream::ostringstream
                  ((ostringstream *)
                   &a.super_struct_helper_base.accessors._M_t._M_impl.super__Rb_tree_header.
                    _M_node_count);
        jsonip::
        write<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>>
                  ((ostream *)
                   &a.super_struct_helper_base.accessors._M_t._M_impl.super__Rb_tree_header.
                    _M_node_count,
                   (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                    *)local_98,true);
        std::__cxx11::stringbuf::str();
        jsonip::
        parse<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>>
                  ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                    *)((long)&str.field_2 + 8),(string *)local_110);
        jsonip::
        write<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>>
                  ((ostream *)&std::cout,
                   (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                    *)((long)&str.field_2 + 8),true);
        poVar3 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        std::endl<char,std::char_traits<char>>(poVar3);
        std::vector<A,_std::allocator<A>_>::vector
                  ((vector<A,_std::allocator<A>_> *)
                   &map._M_t._M_impl.super__Rb_tree_header._M_node_count,0x14,local_34,
                   (allocator_type *)&map2._M_t._M_impl.super__Rb_tree_header._M_node_count);
        jsonip::write<std::vector<A,std::allocator<A>>>
                  ((ostream *)&std::cout,
                   (vector<A,_std::allocator<A>_> *)
                   &map._M_t._M_impl.super__Rb_tree_header._M_node_count,true);
        std::_Vector_base<A,_std::allocator<A>_>::~_Vector_base
                  ((_Vector_base<A,_std::allocator<A>_> *)
                   &map._M_t._M_impl.super__Rb_tree_header._M_node_count);
        poVar3 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        std::endl<char,std::char_traits<char>>(poVar3);
        std::vector<A,_std::allocator<A>_>::vector
                  ((vector<A,_std::allocator<A>_> *)
                   &map2._M_t._M_impl.super__Rb_tree_header._M_node_count,5,local_34,&local_36);
        std::
        vector<std::vector<A,_std::allocator<A>_>,_std::allocator<std::vector<A,_std::allocator<A>_>_>_>
        ::vector((vector<std::vector<A,_std::allocator<A>_>,_std::allocator<std::vector<A,_std::allocator<A>_>_>_>
                  *)&map._M_t._M_impl.super__Rb_tree_header._M_node_count,0x14,
                 (value_type *)&map2._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_35);
        jsonip::
        write<std::vector<std::vector<A,std::allocator<A>>,std::allocator<std::vector<A,std::allocator<A>>>>>
                  ((ostream *)&std::cout,
                   (vector<std::vector<A,_std::allocator<A>_>,_std::allocator<std::vector<A,_std::allocator<A>_>_>_>
                    *)&map._M_t._M_impl.super__Rb_tree_header._M_node_count,true);
        std::
        vector<std::vector<A,_std::allocator<A>_>,_std::allocator<std::vector<A,_std::allocator<A>_>_>_>
        ::~vector((vector<std::vector<A,_std::allocator<A>_>,_std::allocator<std::vector<A,_std::allocator<A>_>_>_>
                   *)&map._M_t._M_impl.super__Rb_tree_header._M_node_count);
        std::_Vector_base<A,_std::allocator<A>_>::~_Vector_base
                  ((_Vector_base<A,_std::allocator<A>_> *)
                   &map2._M_t._M_impl.super__Rb_tree_header._M_node_count);
        poVar3 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        std::endl<char,std::char_traits<char>>(poVar3);
        jsonip::write<B>((ostream *)&std::cout,
                         (B *)&map._M_t._M_impl.super__Rb_tree_header._M_node_count,true);
        poVar3 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        std::endl<char,std::char_traits<char>>(poVar3);
        _Stack_60._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        _Stack_60._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        _Stack_60._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_48 = 0;
        jsonip::write<C>((ostream *)&std::cout,
                         (C *)&map._M_t._M_impl.super__Rb_tree_header._M_node_count,true);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&_Stack_60);
        poVar3 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        std::endl<char,std::char_traits<char>>(poVar3);
        std::__cxx11::string::~string((string *)local_110);
        std::__cxx11::ostringstream::~ostringstream
                  ((ostringstream *)
                   &a.super_struct_helper_base.accessors._M_t._M_impl.super__Rb_tree_header.
                    _M_node_count);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                     *)((long)&str.field_2 + 8));
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                     *)local_98);
        jsonip::detail::struct_helper_base::~struct_helper_base((struct_helper_base *)local_2c0);
        return 0;
      }
      __assertion = "parse(aa, \"{\\\"a\\\" : 120}\")";
      __line = 0x27;
    }
    else {
      __assertion = "parse(aa, \"{}\")";
      __line = 0x26;
    }
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/catedrasaes-umu[P]jsonip/test/test.cpp"
                ,__line,"int main(int, char **)");
}

Assistant:

int main(int argc, char **argv)
{
    typedef detail::struct_helper<A> type_t;
    detail::struct_helper<A> a;
    A aa;
    assert(detail::get_helper(aa));
    holder h(&aa);
    detail::get_helper(aa)->new_child(h, "a");

    assert(parse(aa, "{}"));
    assert(parse(aa, "{\"a\" : 120}"));

    std::cout << (void*)&aa.a << std::endl;
    std::cout << aa.a << std::endl;

    jsonip::write(std::cout, aa);
    std::cout << std::endl << std::endl;

    jsonip::write(std::cout, std::vector<int>(100, 100));
    std::cout << std::endl << std::endl;

    jsonip::write(std::cout, std::vector<std::string>(100, "asd"));
    std::cout << std::endl << std::endl;

    std::map<std::string, double> map, map2;
    for (int i = 0; i < 100; i++)
    {
        std::ostringstream oss;
        oss << i;
        map[oss.str()] = 10.0 / 3.0 * double(i);
    }

    jsonip::write(std::cout, map);
    std::cout << std::endl << std::endl;

    std::ostringstream oss;
    jsonip::write(oss, map);
    const std::string str = oss.str();
    jsonip::parse(map2, str);

    jsonip::write(std::cout, map2);
    std::cout << std::endl << std::endl;

    jsonip::write(std::cout, std::vector<A>(20, aa));
    std::cout << std::endl << std::endl;

    jsonip::write(std::cout,
                  std::vector<std::vector<A> >(20, std::vector<A>(5, aa)));
    std::cout << std::endl << std::endl;

    jsonip::write(std::cout, B());
    std::cout << std::endl << std::endl;

    jsonip::write(std::cout, C());
    std::cout << std::endl << std::endl;

    return 0;
}